

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_copyDDictParameters(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  long in_RSI;
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("dctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9a48,"void ZSTD_copyDDictParameters(ZSTD_DCtx *, const ZSTD_DDict *)");
  }
  if (in_RSI != 0) {
    *(undefined4 *)(in_RDI + 0xebf) = *(undefined4 *)(in_RSI + 0x6ab4);
    in_RDI[0xe99] = *(long *)(in_RSI + 8);
    in_RDI[0xe9a] = *(long *)(in_RSI + 8);
    in_RDI[0xe9b] = *(long *)(in_RSI + 8) + *(long *)(in_RSI + 0x10);
    in_RDI[0xe98] = in_RDI[0xe9b];
    if (*(int *)(in_RSI + 0x6ab8) == 0) {
      *(undefined4 *)(in_RDI + 0xea6) = 0;
      *(undefined4 *)((long)in_RDI + 0x7534) = 0;
    }
    else {
      *(undefined4 *)(in_RDI + 0xea6) = 1;
      *(undefined4 *)((long)in_RDI + 0x7534) = 1;
      *in_RDI = in_RSI + 0x18;
      in_RDI[1] = in_RSI + 0x1828;
      in_RDI[2] = in_RSI + 0x1020;
      in_RDI[3] = in_RSI + 0x2830;
      *(undefined4 *)((long)in_RDI + 0x683c) = *(undefined4 *)(in_RSI + 0x6834);
      *(undefined4 *)(in_RDI + 0xd08) = *(undefined4 *)(in_RSI + 0x6838);
      *(undefined4 *)((long)in_RDI + 0x6844) = *(undefined4 *)(in_RSI + 0x683c);
    }
    return;
  }
  __assert_fail("ddict != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9a49,"void ZSTD_copyDDictParameters(ZSTD_DCtx *, const ZSTD_DDict *)");
}

Assistant:

void ZSTD_copyDDictParameters(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    DEBUGLOG(4, "ZSTD_copyDDictParameters");
    assert(dctx != NULL);
    assert(ddict != NULL);
    dctx->dictID = ddict->dictID;
    dctx->prefixStart = ddict->dictContent;
    dctx->virtualStart = ddict->dictContent;
    dctx->dictEnd = (const BYTE*)ddict->dictContent + ddict->dictSize;
    dctx->previousDstEnd = dctx->dictEnd;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    dctx->dictContentBeginForFuzzing = dctx->prefixStart;
    dctx->dictContentEndForFuzzing = dctx->previousDstEnd;
#endif
    if (ddict->entropyPresent) {
        dctx->litEntropy = 1;
        dctx->fseEntropy = 1;
        dctx->LLTptr = ddict->entropy.LLTable;
        dctx->MLTptr = ddict->entropy.MLTable;
        dctx->OFTptr = ddict->entropy.OFTable;
        dctx->HUFptr = ddict->entropy.hufTable;
        dctx->entropy.rep[0] = ddict->entropy.rep[0];
        dctx->entropy.rep[1] = ddict->entropy.rep[1];
        dctx->entropy.rep[2] = ddict->entropy.rep[2];
    } else {
        dctx->litEntropy = 0;
        dctx->fseEntropy = 0;
    }
}